

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveCardsOperationSnapshotCreator.cpp
# Opt level: O3

void __thiscall
solitaire::archivers::MoveCardsOperationSnapshotCreator::restoreSourcePile
          (MoveCardsOperationSnapshotCreator *this)

{
  Snapshot *pSVar1;
  
  throwIfSourcePileSnapshotIsNullptr(this);
  (*((this->sourcePileSnapshot)._M_t.
     super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
     ._M_t.
     super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
     .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl)->
    _vptr_Snapshot[2])();
  pSVar1 = (this->sourcePileSnapshot)._M_t.
           super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl;
  (this->sourcePileSnapshot)._M_t.
  super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl =
       (Snapshot *)0x0;
  if (pSVar1 != (Snapshot *)0x0) {
    (*pSVar1->_vptr_Snapshot[1])();
    return;
  }
  return;
}

Assistant:

void MoveCardsOperationSnapshotCreator::restoreSourcePile() {
    throwIfSourcePileSnapshotIsNullptr();
    sourcePileSnapshot->restore();
    sourcePileSnapshot = nullptr;
}